

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
mxx::impl::get_displacements<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<int,_std::allocator<int>_> *counts)

{
  int iVar1;
  ulong in_RAX;
  int iVar2;
  int *piVar3;
  int rank;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,counts);
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    iVar2 = 0;
    do {
      if (0x7ffffffe < (ulong)((long)*piVar3 + (long)iVar2)) {
        MPI_Comm_rank(&ompi_mpi_comm_world,(long)&uStack_38 + 4);
        printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",uStack_38 >> 0x20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
               ,0x3a,"get_displacements",
               "(std::size_t)sum + (std::size_t)*begin < (std::size_t) std::numeric_limits<index_t>::max()"
              );
        fflush(_stdout);
        MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
      }
      iVar1 = *piVar3;
      *piVar3 = iVar2;
      piVar3 = piVar3 + 1;
      iVar2 = iVar1 + iVar2;
    } while (piVar3 != (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<index_t> get_displacements(const std::vector<index_t>& counts)
{
    // copy and do an exclusive prefix sum
    std::vector<index_t> result(counts);
    // set the total sum to zero
    index_t sum = 0;
    index_t tmp;

    // calculate the exclusive prefix sum
    typename std::vector<index_t>::iterator begin = result.begin();
    while (begin != result.end())
    {
        tmp = sum;
        // assert that the sum will still fit into the index type (MPI default:
        // int)
        MXX_ASSERT((std::size_t)sum + (std::size_t)*begin < (std::size_t) std::numeric_limits<index_t>::max());
        sum += *begin;
        *begin = tmp;
        ++begin;
    }
    return result;
}